

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_c.cpp
# Opt level: O3

MockValue_c getMockValueCFromNamedValue(MockNamedValue *namedValue)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  anon_union_8_15_d77b29c0_for_value aVar4;
  undefined8 uVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  anon_union_8_15_d77b29c0_for_value extraout_XMM0_Qa;
  MockValue_c MVar6;
  SimpleString SStack_28;
  undefined4 extraout_var;
  
  (*namedValue->_vptr_MockNamedValue[0x18])(&SStack_28,namedValue);
  pcVar3 = SimpleString::asCharString(&SStack_28);
  iVar1 = SimpleString::StrCmp(pcVar3,"bool");
  SimpleString::~SimpleString(&SStack_28);
  if (iVar1 == 0) {
    uVar2 = (*namedValue->_vptr_MockNamedValue[0x19])(namedValue);
    aVar4.unsignedIntValue = uVar2 & 0xff;
    aVar4.longIntValue._4_4_ = 0;
    uVar5 = 0;
  }
  else {
    (*namedValue->_vptr_MockNamedValue[0x18])(&SStack_28,namedValue);
    pcVar3 = SimpleString::asCharString(&SStack_28);
    iVar1 = SimpleString::StrCmp(pcVar3,"int");
    SimpleString::~SimpleString(&SStack_28);
    if (iVar1 == 0) {
      uVar2 = (*namedValue->_vptr_MockNamedValue[0x1a])(namedValue);
      aVar4.longIntValue._4_4_ = 0;
      aVar4.boolValue = uVar2;
      uVar5 = 2;
    }
    else {
      (*namedValue->_vptr_MockNamedValue[0x18])(&SStack_28,namedValue);
      pcVar3 = SimpleString::asCharString(&SStack_28);
      iVar1 = SimpleString::StrCmp(pcVar3,"unsigned int");
      SimpleString::~SimpleString(&SStack_28);
      if (iVar1 == 0) {
        uVar2 = (*namedValue->_vptr_MockNamedValue[0x1b])(namedValue);
        aVar4.longIntValue._4_4_ = 0;
        aVar4.boolValue = uVar2;
        uVar5 = 1;
      }
      else {
        (*namedValue->_vptr_MockNamedValue[0x18])(&SStack_28,namedValue);
        pcVar3 = SimpleString::asCharString(&SStack_28);
        iVar1 = SimpleString::StrCmp(pcVar3,"long int");
        SimpleString::~SimpleString(&SStack_28);
        if (iVar1 == 0) {
          aVar4.boolValue = (*namedValue->_vptr_MockNamedValue[0x1c])(namedValue);
          aVar4.longIntValue._4_4_ = extraout_var_00;
          uVar5 = 3;
        }
        else {
          (*namedValue->_vptr_MockNamedValue[0x18])(&SStack_28,namedValue);
          pcVar3 = SimpleString::asCharString(&SStack_28);
          iVar1 = SimpleString::StrCmp(pcVar3,"unsigned long int");
          SimpleString::~SimpleString(&SStack_28);
          if (iVar1 == 0) {
            aVar4.boolValue = (*namedValue->_vptr_MockNamedValue[0x1d])(namedValue);
            aVar4.longIntValue._4_4_ = extraout_var_01;
            uVar5 = 4;
          }
          else {
            (*namedValue->_vptr_MockNamedValue[0x18])(&SStack_28,namedValue);
            pcVar3 = SimpleString::asCharString(&SStack_28);
            iVar1 = SimpleString::StrCmp(pcVar3,"long long int");
            SimpleString::~SimpleString(&SStack_28);
            if (iVar1 == 0) {
              aVar4.boolValue = (*namedValue->_vptr_MockNamedValue[0x1e])(namedValue);
              aVar4.longIntValue._4_4_ = extraout_var_02;
              uVar5 = 5;
            }
            else {
              (*namedValue->_vptr_MockNamedValue[0x18])(&SStack_28,namedValue);
              pcVar3 = SimpleString::asCharString(&SStack_28);
              iVar1 = SimpleString::StrCmp(pcVar3,"unsigned long long int");
              SimpleString::~SimpleString(&SStack_28);
              if (iVar1 == 0) {
                aVar4.boolValue = (*namedValue->_vptr_MockNamedValue[0x1f])(namedValue);
                aVar4.longIntValue._4_4_ = extraout_var_03;
                uVar5 = 6;
              }
              else {
                (*namedValue->_vptr_MockNamedValue[0x18])(&SStack_28,namedValue);
                pcVar3 = SimpleString::asCharString(&SStack_28);
                iVar1 = SimpleString::StrCmp(pcVar3,"double");
                SimpleString::~SimpleString(&SStack_28);
                if (iVar1 == 0) {
                  (*namedValue->_vptr_MockNamedValue[0x20])(namedValue);
                  uVar5 = 7;
                  aVar4 = extraout_XMM0_Qa;
                }
                else {
                  (*namedValue->_vptr_MockNamedValue[0x18])(&SStack_28,namedValue);
                  pcVar3 = SimpleString::asCharString(&SStack_28);
                  iVar1 = SimpleString::StrCmp(pcVar3,"const char*");
                  SimpleString::~SimpleString(&SStack_28);
                  if (iVar1 == 0) {
                    aVar4.boolValue = (*namedValue->_vptr_MockNamedValue[0x22])(namedValue);
                    aVar4.longIntValue._4_4_ = extraout_var_04;
                    uVar5 = 8;
                  }
                  else {
                    (*namedValue->_vptr_MockNamedValue[0x18])(&SStack_28,namedValue);
                    pcVar3 = SimpleString::asCharString(&SStack_28);
                    iVar1 = SimpleString::StrCmp(pcVar3,"void*");
                    SimpleString::~SimpleString(&SStack_28);
                    if (iVar1 == 0) {
                      aVar4.boolValue = (*namedValue->_vptr_MockNamedValue[0x23])(namedValue);
                      aVar4.longIntValue._4_4_ = extraout_var_05;
                      uVar5 = 9;
                    }
                    else {
                      (*namedValue->_vptr_MockNamedValue[0x18])(&SStack_28,namedValue);
                      pcVar3 = SimpleString::asCharString(&SStack_28);
                      iVar1 = SimpleString::StrCmp(pcVar3,"const void*");
                      SimpleString::~SimpleString(&SStack_28);
                      if (iVar1 == 0) {
                        aVar4.boolValue = (*namedValue->_vptr_MockNamedValue[0x24])(namedValue);
                        aVar4.longIntValue._4_4_ = extraout_var_06;
                        uVar5 = 10;
                      }
                      else {
                        (*namedValue->_vptr_MockNamedValue[0x18])(&SStack_28,namedValue);
                        pcVar3 = SimpleString::asCharString(&SStack_28);
                        iVar1 = SimpleString::StrCmp(pcVar3,"void (*)()");
                        SimpleString::~SimpleString(&SStack_28);
                        if (iVar1 == 0) {
                          aVar4.boolValue = (*namedValue->_vptr_MockNamedValue[0x25])(namedValue);
                          aVar4.longIntValue._4_4_ = extraout_var_07;
                          uVar5 = 0xb;
                        }
                        else {
                          (*namedValue->_vptr_MockNamedValue[0x18])(&SStack_28,namedValue);
                          pcVar3 = SimpleString::asCharString(&SStack_28);
                          iVar1 = SimpleString::StrCmp(pcVar3,"const unsigned char*");
                          SimpleString::~SimpleString(&SStack_28);
                          if (iVar1 == 0) {
                            aVar4.boolValue = (*namedValue->_vptr_MockNamedValue[0x26])(namedValue);
                            aVar4.longIntValue._4_4_ = extraout_var_08;
                            uVar5 = 0xc;
                          }
                          else {
                            aVar4.boolValue = (*namedValue->_vptr_MockNamedValue[0x28])();
                            aVar4.longIntValue._4_4_ = extraout_var;
                            uVar5 = 0xd;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  MVar6.value.longIntValue = aVar4.longIntValue;
  MVar6._0_8_ = uVar5;
  return MVar6;
}

Assistant:

static MockValue_c getMockValueCFromNamedValue(const MockNamedValue& namedValue)
{
    MockValue_c returnValue;
    if (SimpleString::StrCmp(namedValue.getType().asCharString(), "bool") == 0) {
        returnValue.type = MOCKVALUETYPE_BOOL;
        returnValue.value.boolValue = namedValue.getBoolValue() ? 1 : 0;
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "int") == 0) {
        returnValue.type = MOCKVALUETYPE_INTEGER;
        returnValue.value.intValue = namedValue.getIntValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "unsigned int") == 0) {
        returnValue.type = MOCKVALUETYPE_UNSIGNED_INTEGER;
        returnValue.value.unsignedIntValue = namedValue.getUnsignedIntValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "long int") == 0) {
        returnValue.type = MOCKVALUETYPE_LONG_INTEGER;
        returnValue.value.longIntValue = namedValue.getLongIntValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "unsigned long int") == 0) {
        returnValue.type = MOCKVALUETYPE_UNSIGNED_LONG_INTEGER;
        returnValue.value.unsignedLongIntValue = namedValue.getUnsignedLongIntValue();
    }
#if CPPUTEST_USE_LONG_LONG
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "long long int") == 0) {
        returnValue.type = MOCKVALUETYPE_LONG_LONG_INTEGER;
        returnValue.value.longLongIntValue = namedValue.getLongLongIntValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "unsigned long long int") == 0) {
        returnValue.type = MOCKVALUETYPE_UNSIGNED_LONG_LONG_INTEGER;
        returnValue.value.unsignedLongLongIntValue = namedValue.getUnsignedLongLongIntValue();
    }
#endif
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "double") == 0) {
        returnValue.type = MOCKVALUETYPE_DOUBLE;
        returnValue.value.doubleValue = namedValue.getDoubleValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "const char*") == 0) {
        returnValue.type = MOCKVALUETYPE_STRING;
        returnValue.value.stringValue = namedValue.getStringValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "void*") == 0) {
        returnValue.type = MOCKVALUETYPE_POINTER;
        returnValue.value.pointerValue = namedValue.getPointerValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "const void*") == 0) {
        returnValue.type = MOCKVALUETYPE_CONST_POINTER;
        returnValue.value.constPointerValue = namedValue.getConstPointerValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "void (*)()") == 0) {
        returnValue.type = MOCKVALUETYPE_FUNCTIONPOINTER;
        returnValue.value.functionPointerValue = (void (*)()) namedValue.getFunctionPointerValue();
    }
    else if (SimpleString::StrCmp(namedValue.getType().asCharString(), "const unsigned char*") == 0) {
        returnValue.type = MOCKVALUETYPE_MEMORYBUFFER;
        returnValue.value.memoryBufferValue = namedValue.getMemoryBuffer();
    }
    else {
        returnValue.type = MOCKVALUETYPE_OBJECT;
        returnValue.value.objectValue = namedValue.getObjectPointer();
    }